

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semiintersect_iterator.hpp
# Opt level: O1

semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_iterator<char>_>_>_>_>,_std::greater<void>_>
* __thiscall
burst::
make_semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_iterator<char>>*,std::vector<boost::iterator_range<std::_List_iterator<char>>,std::allocator<boost::iterator_range<std::_List_iterator<char>>>>>,int,std::greater<void>>
          (semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_iterator<char>_>_>_>_>,_std::greater<void>_>
           *__return_storage_ptr__,undefined8 param_2,undefined8 param_3,int param_4)

{
  if (0 < param_4) {
    semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_iterator<char>_>_>_>_>,_std::greater<void>_>
    ::semiintersect_iterator();
    return __return_storage_ptr__;
  }
  __assert_fail("min_items > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/semiintersect_iterator.hpp"
                ,0x177,
                "auto burst::make_semiintersect_iterator(RandomAccessIterator, RandomAccessIterator, Integral, Compare) [RandomAccessIterator = __gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_iterator<char>> *, std::vector<boost::iterator_range<std::_List_iterator<char>>>>, Integral = int, Compare = std::greater<void>]"
               );
}

Assistant:

auto
        make_semiintersect_iterator
        (
            RandomAccessIterator first, RandomAccessIterator last,
            Integral min_items,
            Compare compare
        )
    {
        assert(min_items > 0);
        return
            semiintersect_iterator<RandomAccessIterator, Compare>
            (
                std::move(first), std::move(last),
                static_cast<std::size_t>(min_items),
                compare
            );
    }